

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

MemberAccessExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::ValueSymbol_const&,slang::SourceRange&>
          (BumpAllocator *this,Type *args,Expression *args_1,ValueSymbol *args_2,SourceRange *args_3
          )

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  MemberAccessExpression *pMVar3;
  
  pMVar3 = (MemberAccessExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MemberAccessExpression *)this->endPtr < pMVar3 + 1) {
    pMVar3 = (MemberAccessExpression *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pMVar3 + 1);
  }
  SVar1 = args_3->startLoc;
  SVar2 = args_3->endLoc;
  (pMVar3->super_Expression).kind = MemberAccess;
  (pMVar3->super_Expression).type.ptr = args;
  (pMVar3->super_Expression).constant = (ConstantValue *)0x0;
  (pMVar3->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pMVar3->super_Expression).sourceRange.startLoc = SVar1;
  (pMVar3->super_Expression).sourceRange.endLoc = SVar2;
  pMVar3->member = &args_2->super_Symbol;
  pMVar3->value_ = args_1;
  return pMVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }